

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm3.c
# Opt level: O2

int SM3_final_noclear(SM3_CTX *ctx,uint8_t *digest)

{
  _func_void_uint32_t_ptr_uint8_t_ptr_int *p_Var1;
  uint32_t uVar2;
  int iVar3;
  long lVar4;
  size_t __n;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  uint8_t block [64];
  
  p_Var1 = sm3_compress_impl;
  iVar3 = 0;
  if (((digest != (uint8_t *)0x0) && (ctx != (SM3_CTX *)0x0)) &&
     (iVar3 = 0, sm3_compress_impl != (_func_void_uint32_t_ptr_uint8_t_ptr_int *)0x0)) {
    local_98 = *(undefined8 *)ctx->digest;
    uStack_90 = *(undefined8 *)(ctx->digest + 2);
    local_88 = *(undefined8 *)(ctx->digest + 4);
    uStack_80 = *(undefined8 *)(ctx->digest + 6);
    iVar3 = ctx->num;
    __n = (size_t)iVar3;
    memcpy(block,ctx->block,__n);
    block[__n] = 0x80;
    if ((long)__n < 0x38) {
      memset(block + __n + 1,0,(long)(0x37 - iVar3));
    }
    else {
      memset(block + __n + 1,0,0x3f - __n);
      (*p_Var1)((uint32_t *)&local_98,block,1);
      block[0x20] = '\0';
      block[0x21] = '\0';
      block[0x22] = '\0';
      block[0x23] = '\0';
      block[0x24] = '\0';
      block[0x25] = '\0';
      block[0x26] = '\0';
      block[0x27] = '\0';
      block[0x28] = '\0';
      block[0x29] = '\0';
      block[0x2a] = '\0';
      block[0x2b] = '\0';
      block[0x2c] = '\0';
      block[0x2d] = '\0';
      block[0x2e] = '\0';
      block[0x2f] = '\0';
      block[0x10] = '\0';
      block[0x11] = '\0';
      block[0x12] = '\0';
      block[0x13] = '\0';
      block[0x14] = '\0';
      block[0x15] = '\0';
      block[0x16] = '\0';
      block[0x17] = '\0';
      block[0x18] = '\0';
      block[0x19] = '\0';
      block[0x1a] = '\0';
      block[0x1b] = '\0';
      block[0x1c] = '\0';
      block[0x1d] = '\0';
      block[0x1e] = '\0';
      block[0x1f] = '\0';
      block[0] = '\0';
      block[1] = '\0';
      block[2] = '\0';
      block[3] = '\0';
      block[4] = '\0';
      block[5] = '\0';
      block[6] = '\0';
      block[7] = '\0';
      block[8] = '\0';
      block[9] = '\0';
      block[10] = '\0';
      block[0xb] = '\0';
      block[0xc] = '\0';
      block[0xd] = '\0';
      block[0xe] = '\0';
      block[0xf] = '\0';
      block[0x30] = '\0';
      block[0x31] = '\0';
      block[0x32] = '\0';
      block[0x33] = '\0';
      block[0x34] = '\0';
      block[0x35] = '\0';
      block[0x36] = '\0';
      block[0x37] = '\0';
    }
    block._56_4_ = to_be32(ctx->nblocks >> 0x17);
    block._60_4_ = to_be32(ctx->nblocks * 0x200 + iVar3 * 8);
    iVar3 = 1;
    (*sm3_compress_impl)((uint32_t *)&local_98,block,1);
    for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
      uVar2 = to_be32(*(uint32_t *)((long)&local_98 + lVar4 * 4));
      *(uint32_t *)(digest + lVar4 * 4) = uVar2;
    }
    CRYPTO_memzero(&local_98,0x20);
  }
  return iVar3;
}

Assistant:

int SM3_final_noclear(SM3_CTX *ctx, uint8_t *digest)
{
    if (sm3_compress_impl == NULL || ctx == NULL || digest == NULL)
        return GML_ERROR;

    int i;
    int num;
    uint32_t *pdigest = (uint32_t*)digest;
    uint32_t tdigest[8];
    uint8_t block[SM3_BLOCK_SIZE];
    uint32_t *count = (uint32_t*)(block + SM3_BLOCK_SIZE - 8);

    tdigest[0] = ctx->digest[0];
    tdigest[1] = ctx->digest[1];
    tdigest[2] = ctx->digest[2];
    tdigest[3] = ctx->digest[3];
    tdigest[4] = ctx->digest[4];
    tdigest[5] = ctx->digest[5];
    tdigest[6] = ctx->digest[6];
    tdigest[7] = ctx->digest[7];
    num = ctx->num;
    memcpy(block, ctx->block, num);
    block[num] = 0x80U;

    if (num + 9 <= SM3_BLOCK_SIZE) 
        memset(block + num + 1, 0, SM3_BLOCK_SIZE - num - 9);
    else {
        memset(block + num + 1, 0, SM3_BLOCK_SIZE - num - 1);
        sm3_compress_impl(tdigest, block, 1);
        memset(block, 0, SM3_BLOCK_SIZE - 8);
    }

    count[0] = to_be32((ctx->nblocks) >> 23);
    count[1] = to_be32((ctx->nblocks << 9) + (num << 3));

    sm3_compress_impl(tdigest, block, 1);
    for (i = 0; i < sizeof(tdigest)/sizeof(tdigest[0]); i++) 
        pdigest[i] = to_be32(tdigest[i]);

    CRYPTO_memzero(tdigest, SM3_DIGEST_LENGTH);
    return GML_OK;
}